

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSThread_POSIX.c
# Opt level: O1

void OSThread_Cancel(OS_THREAD *thr)

{
  int iVar1;
  
  if (thr->id != 0) {
    iVar1 = pthread_cancel(thr->id);
    if (iVar1 == 0) {
      thr->id = 0;
    }
  }
  return;
}

Assistant:

void OSThread_Cancel(OS_THREAD* thr)
{
	int retVal;
	
	if (! thr->id)
		return;
	
	retVal = pthread_cancel(thr->id);
	if (! retVal)
		thr->id = 0;	// stopped successfully
	
	return;
}